

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

void ggml_graph_compute(ggml_context *ctx,ggml_cgraph *cgraph)

{
  ggml_type gVar1;
  int iVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  pthread_t __th;
  ggml_lock_t gVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ggml_tensor *pgVar9;
  void *pvVar10;
  undefined8 uVar11;
  ggml_cgraph *pgVar12;
  ulong uVar13;
  pthread_t *ppVar14;
  char *pcVar15;
  ulong uVar16;
  pthread_t *__newthread;
  ggml_context *pgVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  pthread_t pStack_a0;
  pthread_t pStack_98;
  ggml_compute_params local_90;
  pthread_t *local_70;
  ulong local_68;
  uint local_5c;
  ggml_context *local_58;
  long local_50;
  ggml_cgraph *local_48;
  undefined4 local_40;
  uint local_3c;
  ggml_compute_state_shared state_shared;
  
  ppVar14 = &pStack_98;
  local_58 = ctx;
  uVar13 = (ulong)(uint)cgraph->n_threads;
  if (cgraph->n_threads < 1) {
    cgraph->n_threads = 8;
    pStack_a0 = 8;
    uVar13 = 8;
  }
  local_40 = 0;
  uVar19 = (uint)uVar13;
  local_3c = uVar19;
  state_shared.spin = 0;
  state_shared.n_threads._0_2_ = 0;
  local_48 = cgraph;
  if (uVar19 < 2) {
    local_70 = (pthread_t *)0x0;
LAB_0011b0a7:
    uVar22 = 0;
    local_50 = uVar13 * 8;
    uVar21 = (ulong)(uint)local_48->n_nodes;
    if (local_48->n_nodes < 1) {
      uVar21 = uVar22;
    }
    uVar20 = 0;
    pgVar12 = local_48;
    uVar16 = uVar13;
    for (; uVar21 != uVar22; uVar22 = uVar22 + 1) {
      pgVar9 = pgVar12->nodes[uVar22];
      switch(pgVar9->op) {
      case GGML_OP_NONE:
      case GGML_OP_DUP:
      case GGML_OP_SUB:
      case GGML_OP_MUL:
      case GGML_OP_DIV:
      case GGML_OP_SQR:
      case GGML_OP_SQRT:
      case GGML_OP_SUM:
      case GGML_OP_MEAN:
      case GGML_OP_REPEAT:
      case GGML_OP_ABS:
      case GGML_OP_SGN:
      case GGML_OP_NEG:
      case GGML_OP_STEP:
      case GGML_OP_RELU:
      case GGML_OP_CPY:
      case GGML_OP_RESHAPE:
      case GGML_OP_VIEW:
      case GGML_OP_PERMUTE:
      case GGML_OP_TRANSPOSE:
      case GGML_OP_GET_ROWS:
      case GGML_OP_DIAG_MASK_INF:
      case GGML_OP_ROPE:
        pgVar9->n_tasks = 1;
        break;
      case GGML_OP_ADD:
      case GGML_OP_GELU:
      case GGML_OP_SILU:
      case GGML_OP_NORM:
      case GGML_OP_RMS_NORM:
      case GGML_OP_SCALE:
      case GGML_OP_SOFT_MAX:
        pgVar9->n_tasks = uVar19;
        break;
      case GGML_OP_MUL_MAT:
        pgVar9->n_tasks = uVar19;
        pgVar4 = pgVar9->src0;
        if (pgVar4->nb[1] < pgVar4->nb[0]) {
          local_68 = uVar16;
          ppVar14[-1] = 0x11b1b0;
          sVar7 = ggml_nbytes(pgVar9);
          uVar8 = sVar7 * local_68;
          pgVar12 = local_48;
          uVar16 = local_68;
          goto LAB_0011b2c5;
        }
        switch(pgVar4->type) {
        case GGML_TYPE_Q4_0:
          pgVar9 = pgVar9->src1;
          if (pgVar9->type == GGML_TYPE_F32) {
            uVar8 = (long)pgVar9->ne[3] * (long)pgVar9->ne[2] *
                    (long)pgVar9->ne[1] * (long)pgVar9->ne[0] * 0x14;
LAB_0011b2c1:
            uVar8 = uVar8 >> 5;
            goto LAB_0011b2c5;
          }
          break;
        case GGML_TYPE_Q4_1:
          pgVar9 = pgVar9->src1;
          if (pgVar9->type == GGML_TYPE_F32) {
            uVar8 = (long)pgVar9->ne[3] * (long)pgVar9->ne[2] *
                    (long)pgVar9->ne[1] * (long)pgVar9->ne[0] * 0x18;
            goto LAB_0011b2c1;
          }
          break;
        case GGML_TYPE_F16:
          pgVar9 = pgVar9->src1;
          if (pgVar9->type == GGML_TYPE_F32) {
            uVar8 = (long)pgVar9->ne[3] * (long)pgVar9->ne[2] *
                    (long)pgVar9->ne[1] * (long)pgVar9->ne[0] * 2;
            goto LAB_0011b2c5;
          }
          break;
        case GGML_TYPE_F32:
          if (pgVar9->src1->type == GGML_TYPE_F32) goto LAB_0011b290;
        }
        pcVar15 = "false";
        uVar11 = 0x24a7;
        goto LAB_0011b601;
      case GGML_OP_CONV_1D_1S:
      case GGML_OP_CONV_1D_2S:
        pgVar9->n_tasks = uVar19;
        pgVar4 = pgVar9->src0;
        if (pgVar4->ne[3] == 1) {
          pgVar9 = pgVar9->src1;
          if (pgVar9->ne[2] == 1) {
            if (pgVar9->ne[3] == 1) {
              iVar6 = pgVar4->ne[0];
              if (pgVar4->type == GGML_TYPE_F32) {
                gVar1 = pgVar9->type;
                ppVar14[-1] = 2;
LAB_0011b1c7:
                uVar11 = ppVar14[-1];
                if (gVar1 == GGML_TYPE_F32) {
                  iVar2 = pgVar4->ne[1];
                  iVar3 = pgVar4->ne[2];
                  ppVar14[-1] = 2;
                  uVar8 = (long)(int)(((iVar6 / (int)ppVar14[-1]) * 2 + pgVar9->ne[0]) *
                                      pgVar9->ne[1] + iVar3 * iVar6 * (iVar2 + 0x1fU & 0xffffffe0))
                          << ((byte)uVar11 & 0x3f);
                  goto LAB_0011b2c5;
                }
              }
              else if (pgVar4->type == GGML_TYPE_F16) {
                gVar1 = pgVar9->type;
                ppVar14[-1] = 1;
                goto LAB_0011b1c7;
              }
              pcVar15 = "false";
              uVar11 = 0x24dc;
            }
            else {
              pcVar15 = "node->src1->ne[3] == 1";
              uVar11 = 0x24ca;
            }
          }
          else {
            pcVar15 = "node->src1->ne[2] == 1";
            uVar11 = 0x24c9;
          }
        }
        else {
          pcVar15 = "node->src0->ne[3] == 1";
          uVar11 = 0x24c8;
        }
        goto LAB_0011b601;
      case GGML_OP_FLASH_ATTN:
        pgVar9->n_tasks = uVar19;
        uVar8 = (long)pgVar9->src1->ne[1] + 3U & 0xfffffffffffffffc;
        gVar1 = pgVar9->src1->type;
        if (gVar1 == GGML_TYPE_F16) {
          uVar8 = (ulong)(int)uVar8;
        }
        else if (gVar1 != GGML_TYPE_F32) goto LAB_0011b290;
LAB_0011b24e:
        uVar8 = uVar8 * local_50;
        goto LAB_0011b2c5;
      case GGML_OP_FLASH_FF:
        pgVar9->n_tasks = uVar19;
        if (pgVar9->src1->type - GGML_TYPE_F16 < 2) {
          uVar8 = (ulong)pgVar9->src1->ne[1];
          goto LAB_0011b24e;
        }
LAB_0011b290:
        uVar8 = 0;
LAB_0011b2c5:
        if (uVar20 <= uVar8) {
          uVar20 = uVar8;
        }
        break;
      case GGML_OP_COUNT:
        pcVar15 = "false";
        uVar11 = 0x250d;
        goto LAB_0011b601;
      }
    }
    if (pgVar12->work == (ggml_tensor *)0x0) {
      if (uVar20 != 0) {
        sVar7 = uVar20 + (long)(int)(uVar19 * 0x40 + -0x40);
        pgVar12->work_size = sVar7;
        ppVar14[-1] = 2;
        pgVar17 = local_58;
        uVar11 = ppVar14[-1];
        ppVar14[-1] = 0x11b32f;
        pgVar9 = ggml_new_tensor_1d(pgVar17,(ggml_type)uVar11,(int)sVar7);
        local_48->work = pgVar9;
        pgVar12 = local_48;
      }
    }
    else if (pgVar12->work_size < uVar20) {
      pcVar15 = "false";
      uVar11 = 0x2513;
      goto LAB_0011b601;
    }
    uVar19 = uVar19 - 1;
    pgVar17 = (ggml_context *)0x0;
    uVar21 = 0;
    if (0 < (int)uVar19) {
      uVar21 = (ulong)uVar19;
    }
    local_50 = uVar21 * 0x38;
    local_68 = uVar13;
    local_5c = uVar19;
    for (; (long)pgVar17 < (long)pgVar12->n_nodes;
        pgVar17 = (ggml_context *)((long)&pgVar17->mem_size + 1)) {
      pgVar9 = pgVar12->nodes[(long)pgVar17];
      local_90.type = GGML_TASK_INIT;
      local_90.ith = 0;
      local_90.nth = pgVar9->n_tasks;
      pgVar4 = pgVar12->work;
      if (pgVar4 == (ggml_tensor *)0x0) {
        local_90.wsize = 0;
        local_90.wdata = (void *)0x0;
      }
      else {
        ppVar14[-1] = 0x11b38b;
        local_90.wsize = ggml_nbytes(pgVar4);
        local_90.wdata = pgVar4->data;
      }
      ppVar14[-1] = 0x11b3b0;
      ggml_compute_forward(&local_90,pgVar9);
      if (1 < pgVar9->n_tasks) {
        ppVar14[-1] = 1;
        gVar5 = state_shared.spin;
        pgVar12 = local_48;
        LOCK();
        state_shared.spin = state_shared.spin + (int)ppVar14[-1];
        UNLOCK();
        if (gVar5 == uVar19) {
          LOCK();
          state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
          UNLOCK();
        }
        local_58 = pgVar17;
        do {
        } while (((ushort)state_shared.n_threads & 1) != 0);
        ppVar14[-1] = 1;
        uVar13 = ppVar14[-1];
        for (lVar18 = 0; local_50 != lVar18; lVar18 = lVar18 + 0x38) {
          iVar6 = pgVar9->n_tasks;
          pgVar4 = pgVar12->work;
          if (pgVar4 == (ggml_tensor *)0x0) {
            sVar7 = 0;
            pvVar10 = (void *)0x0;
          }
          else {
            ppVar14[-1] = 0x11b3fd;
            sVar7 = ggml_nbytes(pgVar4);
            pvVar10 = pgVar4->data;
            pgVar12 = local_48;
          }
          *(undefined4 *)((long)local_70 + lVar18 + 8) = 1;
          *(int *)((long)local_70 + lVar18 + 0xc) = (int)uVar13;
          *(int *)((long)local_70 + lVar18 + 0x10) = iVar6;
          *(size_t *)((long)local_70 + lVar18 + 0x18) = sVar7;
          *(void **)((long)local_70 + lVar18 + 0x20) = pvVar10;
          *(ggml_tensor **)((long)local_70 + lVar18 + 0x28) = pgVar9;
          uVar13 = (ulong)((int)uVar13 + 1);
        }
        LOCK();
        state_shared.spin = state_shared.spin + -1;
        UNLOCK();
        do {
        } while (0 < state_shared.spin);
        LOCK();
        state_shared.n_threads._0_1_ = 1;
        UNLOCK();
        uVar13 = local_68;
        pgVar17 = local_58;
        uVar19 = local_5c;
      }
      local_90.type = GGML_TASK_COMPUTE;
      ppVar14[-1] = 0x11b472;
      ggml_compute_forward(&local_90,pgVar9);
      if (1 < pgVar9->n_tasks) {
        ppVar14[-1] = 1;
        LOCK();
        UNLOCK();
        if (state_shared.spin == uVar19) {
          LOCK();
          state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
          UNLOCK();
        }
        do {
        } while (((ushort)state_shared.n_threads & 1) != 0);
        LOCK();
        state_shared.spin = state_shared.spin + (int)ppVar14[-1] + -1;
        UNLOCK();
        do {
        } while (state_shared.spin != 0);
        if (1 < pgVar9->n_tasks) {
          ppVar14[-1] = 1;
          gVar5 = state_shared.spin;
          pgVar12 = local_48;
          LOCK();
          state_shared.spin = state_shared.spin + (int)ppVar14[-1];
          UNLOCK();
          if (gVar5 == uVar19) {
            LOCK();
            state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
            UNLOCK();
          }
          local_58 = pgVar17;
          do {
          } while (((ushort)state_shared.n_threads & 1) != 0);
          ppVar14[-1] = 1;
          uVar13 = ppVar14[-1];
          for (lVar18 = 0; local_50 != lVar18; lVar18 = lVar18 + 0x38) {
            iVar6 = pgVar9->n_tasks;
            pgVar4 = pgVar12->work;
            if (pgVar4 == (ggml_tensor *)0x0) {
              sVar7 = 0;
              pvVar10 = (void *)0x0;
            }
            else {
              ppVar14[-1] = 0x11b4ee;
              sVar7 = ggml_nbytes(pgVar4);
              pvVar10 = pgVar4->data;
              pgVar12 = local_48;
            }
            *(undefined4 *)((long)local_70 + lVar18 + 8) = 2;
            *(int *)((long)local_70 + lVar18 + 0xc) = (int)uVar13;
            *(int *)((long)local_70 + lVar18 + 0x10) = iVar6;
            *(size_t *)((long)local_70 + lVar18 + 0x18) = sVar7;
            *(void **)((long)local_70 + lVar18 + 0x20) = pvVar10;
            *(ggml_tensor **)((long)local_70 + lVar18 + 0x28) = pgVar9;
            uVar13 = (ulong)((int)uVar13 + 1);
          }
          LOCK();
          state_shared.spin = state_shared.spin + -1;
          UNLOCK();
          do {
          } while (0 < state_shared.spin);
          LOCK();
          state_shared.n_threads._0_1_ = 1;
          UNLOCK();
          uVar13 = local_68;
          pgVar17 = local_58;
          uVar19 = local_5c;
        }
      }
      local_90.type = GGML_TASK_FINALIZE;
      ppVar14[-1] = 0x11b563;
      ggml_compute_forward(&local_90,pgVar9);
      pgVar12 = local_48;
      if (1 < pgVar9->n_tasks) {
        ppVar14[-1] = 1;
        LOCK();
        UNLOCK();
        if (state_shared.spin == uVar19) {
          LOCK();
          state_shared.n_threads._0_2_ = (ushort)state_shared.n_threads & 0xff00;
          UNLOCK();
        }
        do {
        } while (((ushort)state_shared.n_threads & 1) != 0);
        LOCK();
        state_shared.spin = state_shared.spin + (int)ppVar14[-1] + -1;
        UNLOCK();
        do {
        } while (state_shared.spin != 0);
      }
      pgVar9->perf_runs = pgVar9->perf_runs + 1;
    }
    if ((uint)uVar13 < 2) {
LAB_0011b60d:
      pgVar12->perf_runs = pgVar12->perf_runs + 1;
      return;
    }
    LOCK();
    UNLOCK();
    LOCK();
    state_shared.n_threads._0_2_ = 0x101;
    UNLOCK();
    lVar18 = 0;
    do {
      if ((ulong)uVar19 * 0x38 + 0x38 == lVar18 + 0x38) goto LAB_0011b60d;
      __th = *(pthread_t *)((long)local_70 + lVar18);
      ppVar14[-1] = 0x11b5d2;
      iVar6 = pthread_join(__th,(void **)0x0);
      lVar18 = lVar18 + 0x38;
      pgVar12 = local_48;
    } while (iVar6 == 0);
    pcVar15 = "rc == 0";
    uVar11 = 0x25b9;
  }
  else {
    lVar18 = -((ulong)(uVar19 - 1) * 0x38 + 0xf & 0xfffffffffffffff0);
    ppVar14 = (pthread_t *)((long)&pStack_98 + lVar18);
    LOCK();
    state_shared.n_threads._0_2_ = 1;
    UNLOCK();
    uVar21 = 0;
    local_70 = ppVar14;
    __newthread = ppVar14;
    do {
      if (uVar19 - 1 == uVar21) goto LAB_0011b0a7;
      pgVar9 = local_48->work;
      if (pgVar9 == (ggml_tensor *)0x0) {
        sVar7 = 0;
        pvVar10 = (void *)0x0;
      }
      else {
        *(undefined8 *)((long)&pStack_a0 + lVar18) = 0x11b010;
        sVar7 = ggml_nbytes(pgVar9);
        pvVar10 = pgVar9->data;
      }
      *__newthread = 0;
      *(undefined4 *)(__newthread + 1) = 1;
      uVar21 = uVar21 + 1;
      *(int *)((long)__newthread + 0xc) = (int)uVar21;
      *(uint *)(__newthread + 2) = uVar19;
      __newthread[3] = sVar7;
      __newthread[4] = (pthread_t)pvVar10;
      __newthread[5] = 0;
      __newthread[6] = (pthread_t)&local_40;
      *(undefined8 *)((long)&pStack_a0 + lVar18) = 0x11b065;
      iVar6 = pthread_create(__newthread,(pthread_attr_t *)0x0,ggml_graph_compute_thread,__newthread
                            );
      __newthread = __newthread + 7;
    } while (iVar6 == 0);
    pcVar15 = "rc == 0";
    uVar11 = 0x2436;
  }
LAB_0011b601:
  ppVar14[-1] = 0x11b608;
  fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",uVar11,
          pcVar15);
  ppVar14[-1] = 0x11b60d;
  abort();
}

Assistant:

void ggml_graph_compute(struct ggml_context * ctx, struct ggml_cgraph * cgraph) {
    if (cgraph->n_threads <= 0) {
        cgraph->n_threads = 8;
    }

    const int n_threads = cgraph->n_threads;

    struct ggml_compute_state_shared state_shared = {
        /*.spin      =*/ GGML_LOCK_INITIALIZER,
        /*.n_threads =*/ n_threads,
        /*.n_ready   =*/ 0,
        /*.has_work  =*/ false,
        /*.stop      =*/ false,
    };
    struct ggml_compute_state * workers = n_threads > 1 ? alloca(sizeof(struct ggml_compute_state)*(n_threads - 1)) : NULL;

    // create thread pool
    if (n_threads > 1) {
        ggml_lock_init(&state_shared.spin);

        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            workers[j] = (struct ggml_compute_state) {
                .thrd   = 0,
                .params = {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = n_threads,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                },
                .node   = NULL,
                .shared = &state_shared,
            };

            int rc = ggml_thread_create(&workers[j].thrd, NULL, ggml_graph_compute_thread, &workers[j]);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }
    }

    // initialize tasks + work buffer
    {
        size_t work_size = 0;

        // thread scheduling for the different operations
        for (int i = 0; i < cgraph->n_nodes; i++) {
            struct ggml_tensor * node = cgraph->nodes[i];

            switch (node->op) {
                case GGML_OP_DUP:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_ADD:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SUB:
                case GGML_OP_MUL:
                case GGML_OP_DIV:
                case GGML_OP_SQR:
                case GGML_OP_SQRT:
                case GGML_OP_SUM:
                case GGML_OP_MEAN:
                case GGML_OP_REPEAT:
                case GGML_OP_ABS:
                case GGML_OP_SGN:
                case GGML_OP_NEG:
                case GGML_OP_STEP:
                case GGML_OP_RELU:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_GELU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_SILU:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_NORM:
                case GGML_OP_RMS_NORM:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_MUL_MAT:
                    {
                        node->n_tasks = n_threads;

                        // TODO: use different scheduling for different matrix sizes
                        //const int nr0 = ggml_nrows(node->src0);
                        //const int nr1 = ggml_nrows(node->src1);

                        //node->n_tasks = MIN(n_threads, MAX(1, nr0/128));
                        //printf("nr0 = %8d, nr1 = %8d, nr0*nr1 = %8d, n_tasks = %d\n", nr0, nr1, nr0*nr1, node->n_tasks);

                        size_t cur = 0;

                        // TODO: better way to determine if the matrix is transposed
                        if (node->src0->nb[1] < node->src0->nb[0]) {
                            cur = ggml_nbytes(node)*node->n_tasks; // TODO: this can become (n_tasks-1)
                                                                   // TODO: overestimated by factor of x2 for FP16
                        } else {
                            if (node->src0->type == GGML_TYPE_F16 &&
                                node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1; // TODO: this actually is doing nothing
                                                       //       the threads are still spinning
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src0: ne0 = %d, ne1 = %d, ne = %d\n", node->src0->ne[0], node->src0->ne[1], node->src0->ne[0]*node->src0->ne[1]);
                                    //printf("src1: ne0 = %d, ne1 = %d, ne = %d\n", node->src1->ne[0], node->src1->ne[1], node->src1->ne[0]*node->src1->ne[1]);
                                    //printf("cur = %zu\n", cur);
                                } else {
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
                                }
#else
                                cur = GGML_TYPE_SIZE[GGML_TYPE_F16]*ggml_nelements(node->src1);
#endif
                            } else if (node->src0->type == GGML_TYPE_F32 &&
                                       node->src1->type == GGML_TYPE_F32) {
                                cur = 0;
                            } else if (node->src0->type == GGML_TYPE_Q4_0 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_0]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_0];
#endif
                            } else if (node->src0->type == GGML_TYPE_Q4_1 &&
                                       node->src1->type == GGML_TYPE_F32) {
#if defined(GGML_USE_ACCELERATE) || defined(GGML_USE_OPENBLAS)
                                if (ggml_compute_forward_mul_mat_use_blas(node->src0, node->src1, node)) {
                                    node->n_tasks = 1;
                                    cur = GGML_TYPE_SIZE[GGML_TYPE_F32]*(node->src0->ne[0]*node->src0->ne[1]);
                                } else {
                                    cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
                                }
#else
                                cur = (GGML_TYPE_SIZE[GGML_TYPE_Q4_1]*ggml_nelements(node->src1))/GGML_BLCK_SIZE[GGML_TYPE_Q4_1];
#endif
                            } else {
                                GGML_ASSERT(false);
                            }
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_SCALE:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_CPY:
                case GGML_OP_RESHAPE:
                case GGML_OP_VIEW:
                case GGML_OP_PERMUTE:
                case GGML_OP_TRANSPOSE:
                case GGML_OP_GET_ROWS:
                case GGML_OP_DIAG_MASK_INF:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_SOFT_MAX:
                    {
                        node->n_tasks = n_threads;
                    } break;
                case GGML_OP_ROPE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_CONV_1D_1S:
                case GGML_OP_CONV_1D_2S:
                    {
                        node->n_tasks = n_threads;

                        GGML_ASSERT(node->src0->ne[3] == 1);
                        GGML_ASSERT(node->src1->ne[2] == 1);
                        GGML_ASSERT(node->src1->ne[3] == 1);

                        size_t cur = 0;
                        const int nk = node->src0->ne[0];

                        if (node->src0->type == GGML_TYPE_F16 &&
                            node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(ggml_fp16_t)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else if (node->src0->type == GGML_TYPE_F32 &&
                                   node->src1->type == GGML_TYPE_F32) {
                            cur = sizeof(float)*(
                                    nk*ggml_up32(node->src0->ne[1])*node->src0->ne[2] +
                                    ( 2*(nk/2) + node->src1->ne[0])*node->src1->ne[1]
                                    );
                        } else {
                            GGML_ASSERT(false);
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_ATTN:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        const int ne11 = ggml_up(node->src1->ne[1], GGML_SOFT_MAX_UNROLL);

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*ne11*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*ne11*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_FLASH_FF:
                    {
                        node->n_tasks = n_threads;

                        size_t cur = 0;

                        if (node->src1->type == GGML_TYPE_F32) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        if (node->src1->type == GGML_TYPE_F16) {
                            cur  = sizeof(float)*node->src1->ne[1]*node->n_tasks; // TODO: this can become (n_tasks-1)
                            cur += sizeof(float)*node->src1->ne[1]*node->n_tasks; // this is overestimated by x2
                        }

                        work_size = MAX(work_size, cur);
                    } break;
                case GGML_OP_NONE:
                    {
                        node->n_tasks = 1;
                    } break;
                case GGML_OP_COUNT:
                    {
                        GGML_ASSERT(false);
                    } break;
            }
        }

        if (cgraph->work != NULL && work_size > cgraph->work_size) {
            GGML_ASSERT(false); // TODO: better handling
        }

        if (work_size > 0 && cgraph->work == NULL) {
            cgraph->work_size = work_size + CACHE_LINE_SIZE*(n_threads - 1);

            GGML_PRINT_DEBUG("%s: allocating work buffer for graph (%zu bytes)\n", __func__, cgraph->work_size);
            cgraph->work = ggml_new_tensor_1d(ctx, GGML_TYPE_I8, cgraph->work_size);
        }
    }

    const int64_t perf_start_cycles  = ggml_perf_cycles();
    const int64_t perf_start_time_us = ggml_perf_time_us();

    for (int i = 0; i < cgraph->n_nodes; i++) {
        GGML_PRINT_DEBUG_5("%s: %d/%d\n", __func__, i, cgraph->n_nodes);

        struct ggml_tensor * node = cgraph->nodes[i];

        // TODO: this could be used to avoid unnecessary computations, but it needs to be improved
        //if (node->grad == NULL && node->perf_runs > 0) {
        //    continue;
        //}

        const int64_t perf_node_start_cycles  = ggml_perf_cycles();
        const int64_t perf_node_start_time_us = ggml_perf_time_us();

        // INIT
        struct ggml_compute_params params = {
            /*.type  =*/ GGML_TASK_INIT,
            /*.ith   =*/ 0,
            /*.nth   =*/ node->n_tasks,
            /*.wsize =*/ cgraph->work ? ggml_nbytes(cgraph->work) : 0,
            /*.wdata =*/ cgraph->work ? cgraph->work->data : NULL,
        };

        ggml_compute_forward(&params, node);

        // COMPUTE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_COMPUTE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_COMPUTE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // FINALIZE
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            // launch thread pool
            for (int j = 0; j < n_threads - 1; j++) {
                workers[j].params = (struct ggml_compute_params) {
                    .type  = GGML_TASK_FINALIZE,
                    .ith   = j + 1,
                    .nth   = node->n_tasks,
                    .wsize = cgraph->work ? ggml_nbytes(cgraph->work) : 0,
                    .wdata = cgraph->work ? cgraph->work->data : NULL,
                };
                workers[j].node = node;
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) > 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_store(&state_shared.has_work, true);
        }

        params.type = GGML_TASK_FINALIZE;
        ggml_compute_forward(&params, node);

        // wait for thread pool
        if (node->n_tasks > 1) {
            if (atomic_fetch_add(&state_shared.n_ready, 1) == n_threads - 1) {
                atomic_store(&state_shared.has_work, false);
            }

            while (atomic_load(&state_shared.has_work)) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }

            atomic_fetch_sub(&state_shared.n_ready, 1);

            while (atomic_load(&state_shared.n_ready) != 0) {
                ggml_lock_lock  (&state_shared.spin);
                ggml_lock_unlock(&state_shared.spin);
            }
        }

        // performance stats (node)
        {
            int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_node_start_cycles;
            int64_t perf_time_us_cur = ggml_perf_time_us() - perf_node_start_time_us;

            node->perf_runs++;
            node->perf_cycles  += perf_cycles_cur;
            node->perf_time_us += perf_time_us_cur;
        }
    }

    // join thread pool
    if (n_threads > 1) {
        atomic_store(&state_shared.stop, true);
        atomic_store(&state_shared.has_work, true);

        for (int j = 0; j < n_threads - 1; j++) {
            int rc = ggml_thread_join(workers[j].thrd, NULL);
            GGML_ASSERT(rc == 0);
            UNUSED(rc);
        }

        ggml_lock_destroy(&state_shared.spin);
    }

    // performance stats (graph)
    {
        int64_t perf_cycles_cur  = ggml_perf_cycles()  - perf_start_cycles;
        int64_t perf_time_us_cur = ggml_perf_time_us() - perf_start_time_us;

        cgraph->perf_runs++;
        cgraph->perf_cycles  += perf_cycles_cur;
        cgraph->perf_time_us += perf_time_us_cur;

        GGML_PRINT_DEBUG("%s: perf (%d) - cpu = %.3f / %.3f ms, wall = %.3f / %.3f ms\n",
                __func__, cgraph->perf_runs,
                (double) perf_cycles_cur      / (double) ggml_cycles_per_ms(),
                (double) cgraph->perf_cycles  / (double) ggml_cycles_per_ms() / (double) cgraph->perf_runs,
                (double) perf_time_us_cur     / 1000.0,
                (double) cgraph->perf_time_us / 1000.0 / cgraph->perf_runs);
    }
}